

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

StringView __thiscall
anon_unknown.dwarf_38e3a9::SpecialSubstitution::getBaseName(SpecialSubstitution *this)

{
  long lVar1;
  StringView SVar2;
  
  lVar1 = (long)*(int *)&(this->super_Node).field_0xc;
  SVar2.Last = &DAT_001b6d3c + *(int *)(&DAT_001b6d3c + lVar1 * 4);
  SVar2.First = &DAT_001b6d54 + *(int *)(&DAT_001b6d54 + lVar1 * 4);
  return SVar2;
}

Assistant:

StringView getBaseName() const override {
    switch (SSK) {
    case SpecialSubKind::allocator:
      return StringView("allocator");
    case SpecialSubKind::basic_string:
      return StringView("basic_string");
    case SpecialSubKind::string:
      return StringView("string");
    case SpecialSubKind::istream:
      return StringView("istream");
    case SpecialSubKind::ostream:
      return StringView("ostream");
    case SpecialSubKind::iostream:
      return StringView("iostream");
    }
    LLVM_BUILTIN_UNREACHABLE;
  }